

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void vdbeLeave(Vdbe *p)

{
  int *piVar1;
  Btree *p_00;
  long lVar2;
  long lVar3;
  Btree **ppBVar4;
  
  lVar3 = (long)p->db->nDb;
  if (0 < lVar3) {
    ppBVar4 = &p->db->aDb->pBt;
    lVar2 = 0;
    do {
      if ((((lVar2 != 1) && ((p->lockMask >> ((uint)lVar2 & 0x1f) & 1) != 0)) &&
          (p_00 = *ppBVar4, p_00 != (Btree *)0x0)) && (p_00->sharable != '\0')) {
        piVar1 = &p_00->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(p_00);
        }
      }
      lVar2 = lVar2 + 1;
      ppBVar4 = ppBVar4 + 4;
    } while (lVar3 != lVar2);
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeLeave(Vdbe *p){
  int i;
  sqlite3 *db;
  Db *aDb;
  int nDb;
  db = p->db;
  aDb = db->aDb;
  nDb = db->nDb;
  for(i=0; i<nDb; i++){
    if( i!=1 && DbMaskTest(p->lockMask,i) && ALWAYS(aDb[i].pBt!=0) ){
      sqlite3BtreeLeave(aDb[i].pBt);
    }
  }
}